

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O2

void TestStringToFloatVarious(void)

{
  ulong in_RAX;
  bool *pbVar1;
  bool *processed_all;
  int in_R9D;
  double dVar2;
  bool all_used;
  ulong uStack_38;
  int processed;
  
  processed_all = &all_used;
  pbVar1 = processed_all;
  uStack_38 = in_RAX;
  dVar2 = StrToF("",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfc3,0xc1892c,"StrToF(\"\", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xfc4,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("",0x38,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfc6,0xc18e85,"StrToF(\"\", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xfc7,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfc9,0xc1892c,"StrToF(\"  \", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xfca,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0x38,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfcc,0xc18e85,"StrToF(\"  \", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xfcd,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("42",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfcf,0xc1751f,"StrToF(\"42\", flags, 0.0f, &processed, &all_used)",42.0
                    ,pbVar1,dVar2);
  CheckHelper((char *)0xfd0,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 ",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfd2,0xc1751f,"StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckHelper((char *)0xfd3,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 ",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfd5,0xc1751e,"StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)",
                    -42.0,pbVar1,dVar2);
  CheckHelper((char *)0xfd6,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("x",0x38,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfd8,0xc131d8,"StrToF(\"x\", flags, 1.0f, &processed, &all_used)",NAN,
                    pbVar1,dVar2);
  CheckEqualsHelper((char *)0xfd9,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = processed_all;
  dVar2 = StrToF(" x",0x38,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfdb,0xc131d8,"StrToF(\" x\", flags, 1.0f, &processed, &all_used)",NAN,
                    pbVar1,dVar2);
  CheckEqualsHelper((char *)0xfdc,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = processed_all;
  dVar2 = StrToF("42x",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfde,0xc131d8,"StrToF(\"42x\", flags, 0.0f, &processed, &all_used)",NAN
                    ,pbVar1,dVar2);
  CheckEqualsHelper((char *)0xfdf,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = processed_all;
  dVar2 = StrToF("42 x",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfe1,0xc131d8,"StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)",
                    NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0xfe2,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 x",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfe4,0xc131d8,"StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)"
                    ,NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0xfe5,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 x",0x38,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfe7,0xc131d8,"StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)"
                    ,NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0xfe8,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D);
  pbVar1 = processed_all;
  dVar2 = StrToF("",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xff0,0xc1892c,"StrToF(\"\", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xff1,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("",0x3c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xff3,0xc18e85,"StrToF(\"\", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xff4,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xff6,0xc1892c,"StrToF(\"  \", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xff7,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0x3c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xff9,0xc18e85,"StrToF(\"  \", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0xffa,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("42",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xffc,0xc1751f,"StrToF(\"42\", flags, 0.0f, &processed, &all_used)",42.0
                    ,pbVar1,dVar2);
  CheckHelper((char *)0xffd,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 ",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0xfff,0xc1751f,"StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckHelper((char *)0x1000,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 ",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1002,0xc1751e,"StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)"
                    ,-42.0,pbVar1,dVar2);
  CheckHelper((char *)0x1003,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("x",0x3c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1005,0xc131d8,"StrToF(\"x\", flags, 1.0f, &processed, &all_used)",NAN,
                    pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1006,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" x",0x3c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1008,0xc131d8,"StrToF(\" x\", flags, 1.0f, &processed, &all_used)",NAN
                    ,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1009,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42x",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x100b,0xc1751f,"StrToF(\"42x\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x100c,0xc17304,(char *)0x2,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42 x",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x100e,0xc1751f,"StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x100f,0xc139ca,(char *)0x3,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 x",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1011,0xc1751f,
                    "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)",42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1012,0xc0e14d,(char *)0x6,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 x",0x3c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1014,0xc1751e,
                    "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)",-42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1015,0xc0e14d,(char *)0x6,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x101c,0xc1892c,"StrToF(\"\", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x101d,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("",0x2c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x101f,0xc18e85,"StrToF(\"\", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x1020,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1022,0xc1892c,"StrToF(\"  \", flags, 0.0f, &processed, &all_used)",0.0
                    ,pbVar1,dVar2);
  CheckHelper((char *)0x1023,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0x2c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1025,0xc18e85,"StrToF(\"  \", flags, 1.0f, &processed, &all_used)",1.0
                    ,pbVar1,dVar2);
  CheckHelper((char *)0x1026,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("42",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1028,0xc1751f,"StrToF(\"42\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckHelper((char *)0x1029,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 ",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x102b,0xc1751f,"StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)"
                    ,42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x102c,0xc1dc95,(char *)0x5,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 ",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x102e,0xc1751e,"StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)"
                    ,-42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x102f,0xc1dc95,(char *)0x5,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("x",0x2c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1031,0xc131d8,"StrToF(\"x\", flags, 1.0f, &processed, &all_used)",NAN,
                    pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1032,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" x",0x2c,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1034,0xc131d8,"StrToF(\" x\", flags, 1.0f, &processed, &all_used)",NAN
                    ,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1035,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42x",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1037,0xc1751f,"StrToF(\"42x\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1038,0xc17304,(char *)0x2,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42 x",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x103a,0xc1751f,"StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x103b,0xc17304,(char *)0x2,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 x",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x103d,0xc1751f,
                    "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)",42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x103e,0xc1dc95,(char *)0x5,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 x",0x2c,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1040,0xc1751e,
                    "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)",-42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1041,0xc1dc95,(char *)0x5,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" +42 ",0xc,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1046,0xc1751f,"StrToF(\" +42 \", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1047,0xc172c2,(char *)0x4,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" -42 ",0xc,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1049,0xc1751e,"StrToF(\" -42 \", flags, 0.0f, &processed, &all_used)",
                    -42.0,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x104a,0xc172c2,(char *)0x4,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 ",0xc,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x104c,0xc131d8,"StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)"
                    ,NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x104d,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 ",0xc,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x104f,0xc131d8,"StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)"
                    ,NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1050,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1055,0xc1892c,"StrToF(\"\", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x1056,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("",0,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1058,0xc18e85,"StrToF(\"\", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x1059,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x105b,0xc131d8,"StrToF(\"  \", flags, 0.0f, &processed, &all_used)",NAN
                    ,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x105c,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("  ",0,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x105e,0xc131d8,"StrToF(\"  \", flags, 1.0f, &processed, &all_used)",NAN
                    ,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x105f,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1061,0xc1751f,"StrToF(\"42\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckHelper((char *)0x1062,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 ",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1064,0xc131d8,"StrToF(\" + 42 \", flags, 0.0f, &processed, &all_used)"
                    ,NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1065,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 ",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1067,0xc131d8,"StrToF(\" - 42 \", flags, 0.0f, &processed, &all_used)"
                    ,NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1068,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("x",0,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x106a,0xc131d8,"StrToF(\"x\", flags, 1.0f, &processed, &all_used)",NAN,
                    pbVar1,dVar2);
  CheckEqualsHelper((char *)0x106b,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" x",0,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x106d,0xc131d8,"StrToF(\" x\", flags, 1.0f, &processed, &all_used)",NAN
                    ,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x106e,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42x",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1070,0xc131d8,"StrToF(\"42x\", flags, 0.0f, &processed, &all_used)",
                    NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1071,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF("42 x",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1073,0xc131d8,"StrToF(\"42 x\", flags, 0.0f, &processed, &all_used)",
                    NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1074,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" + 42 x",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1076,0xc131d8,
                    "StrToF(\" + 42 x\", flags, 0.0f, &processed, &all_used)",NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1077,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" - 42 x",0,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1079,0xc131d8,
                    "StrToF(\" - 42 x\", flags, 0.0f, &processed, &all_used)",NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x107a,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" ",8,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x107f,0xc1892c,"StrToF(\" \", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x1080,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" ",8,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1082,0xc18e85,"StrToF(\" \", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x1083,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" 42",8,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1085,0xc1751f,"StrToF(\" 42\", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckHelper((char *)0x1086,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("42 ",8,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1088,0xc131d8,"StrToF(\"42 \", flags, 0.0f, &processed, &all_used)",
                    NAN,pbVar1,dVar2);
  CheckEqualsHelper((char *)0x1089,0xc1672f,(char *)0x0,0xc13215,(char *)(uStack_38 >> 0x20),in_R9D)
  ;
  pbVar1 = processed_all;
  dVar2 = StrToF(" ",0x10,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x108e,0xc1892c,"StrToF(\" \", flags, 0.0f, &processed, &all_used)",0.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x108f,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF(" ",0x10,1.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1091,0xc18e85,"StrToF(\" \", flags, 1.0f, &processed, &all_used)",1.0,
                    pbVar1,dVar2);
  CheckHelper((char *)0x1092,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  pbVar1 = processed_all;
  dVar2 = StrToF("42 ",0x10,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1094,0xc1751f,"StrToF(\"42 \", flags, 0.0f, &processed, &all_used)",
                    42.0,pbVar1,dVar2);
  CheckHelper((char *)0x1095,0xc13095,(char *)(uStack_38 >> 0x18 & 0xff),SUB81(pbVar1,0));
  dVar2 = StrToF(" 42",0x10,0.0,&processed,processed_all);
  CheckEqualsHelper((char *)0x1097,0xc131d8,"StrToF(\" 42\", flags, 0.0f, &processed, &all_used)",
                    NAN,processed_all,dVar2);
  CheckEqualsHelper((char *)0x1098,0xc1672f,(char *)0x0,0xc13215,(char *)(ulong)(uint)processed,
                    in_R9D);
  return;
}

Assistant:

TEST(StringToFloatVarious) {
  int flags;
  int processed;
  bool all_used;

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(3, processed);

  CHECK_EQ(42.0f, StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(6, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(6, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_SPACES_AFTER_SIGN |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(0.0f, StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(2, processed);

  CHECK_EQ(42.0f, StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  CHECK_EQ(-42.0f, StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(5, processed);

  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES |
      StringToDoubleConverter::ALLOW_TRAILING_JUNK;

  CHECK_EQ(42.0f, StrToF(" +42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(-42.0f, StrToF(" -42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(4, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::NO_FLAGS;

  CHECK_EQ(0.0f, StrToF("", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF("", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("  ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("  ", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(42.0f, StrToF("42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" x", flags, 1.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF("42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" + 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);

  CHECK_EQ(Double::NaN(), StrToF(" - 42 x", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_LEADING_SPACES;

  CHECK_EQ(0.0f, StrToF(" ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF(" ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF(" 42", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF("42 ", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);


  flags = StringToDoubleConverter::ALLOW_TRAILING_SPACES;

  CHECK_EQ(0.0f, StrToF(" ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(1.0f, StrToF(" ", flags, 1.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(42.0f, StrToF("42 ", flags, 0.0f, &processed, &all_used));
  CHECK(all_used);

  CHECK_EQ(Double::NaN(), StrToF(" 42", flags, 0.0f, &processed, &all_used));
  CHECK_EQ(0, processed);
}